

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

string * __thiscall
phosg::format_data_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,void *data,uint64_t size,
          uint64_t start_address,void *prev,uint64_t flags)

{
  uint64_t *start_address_00;
  iovec iov;
  iovec prev_iov;
  uint64_t in_stack_ffffffffffffffd0;
  phosg *local_28;
  void *local_20;
  uint64_t local_18;
  void *local_10;
  
  if (start_address == 0) {
    start_address_00 = (uint64_t *)0x0;
  }
  else {
    start_address_00 = &local_18;
    local_18 = start_address;
    local_10 = data;
  }
  local_28 = this;
  local_20 = data;
  format_data_abi_cxx11_
            (__return_storage_ptr__,(phosg *)&local_28,(iovec *)0x1,size,(uint64_t)start_address_00,
             (iovec *)(ulong)(start_address != 0),(size_t)prev,in_stack_ffffffffffffffd0);
  return __return_storage_ptr__;
}

Assistant:

string format_data(const void* data, uint64_t size, uint64_t start_address, const void* prev, uint64_t flags) {
  iovec iov;
  iov.iov_base = const_cast<void*>(data);
  iov.iov_len = size;
  if (prev) {
    iovec prev_iov;
    prev_iov.iov_base = const_cast<void*>(prev);
    prev_iov.iov_len = size;
    return format_data(&iov, 1, start_address, &prev_iov, 1, flags);
  } else {
    return format_data(&iov, 1, start_address, nullptr, 0, flags);
  }
}